

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O3

void testStandardAttributes(string *tempDir)

{
  float *pfVar1;
  CubeMapFace CVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  _Alloc_hider name;
  V2f VVar5;
  undefined8 uVar6;
  bool bVar7;
  unsigned_short uVar8;
  int iVar9;
  uint uVar10;
  ostream *poVar11;
  Header *pHVar12;
  Chromaticities *pCVar13;
  Box2i *pBVar14;
  Rgba *pRVar15;
  half *phVar16;
  KeyCode *this;
  int iVar17;
  int iVar18;
  int x_4;
  int i;
  CubeMapFace CVar19;
  Vec2<float> *pVVar20;
  V2f *pVVar21;
  int x;
  CubeMapFace face_00;
  long lVar22;
  long lVar23;
  int i_3;
  int x_5;
  uif x_1;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar58;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  string filename;
  Chromaticities c;
  RgbaOutputFile out;
  CubeMapFace face;
  undefined1 auStack_484 [4];
  V2f pos;
  Rational r9;
  Rand48 rand_1;
  undefined2 uStack_44a;
  M44f M2;
  Rand48 rand;
  undefined2 uStack_3f2;
  CubeMapFace face_2;
  undefined1 auStack_3cc [4];
  V2f pos_2;
  Vec3<float> local_3b8;
  V2f pif;
  undefined1 local_368 [8];
  undefined1 local_360 [8];
  M44f M1;
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar49 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing optional standard attributes",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"conversion from RGB to XYZ",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  M1.x[0][0] = 0.64;
  M1.x[0][1] = 0.33;
  M2.x[0][0] = 0.3;
  M2.x[0][1] = 0.6;
  filename._M_dataplus._M_p = (pointer)0x3d75c28f3e19999a;
  out._vptr_RgbaOutputFile = (_func_int **)0x3ea872b03ea01a37;
  Imf_2_5::Chromaticities::Chromaticities(&c,(V2f *)&M1,(V2f *)&M2,(V2f *)&filename,(V2f *)&out);
  Imf_2_5::RGBtoXYZ(&M1,&c,100.0);
  fVar55 = M1.x[0][3] + M1.x[1][3] * 0.0 + M1.x[2][3] * 0.0 + M1.x[3][3];
  filename._M_string_length._0_4_ =
       (M1.x[0][2] + M1.x[1][2] * 0.0 + M1.x[2][2] * 0.0 + M1.x[3][2]) / fVar55;
  fVar58 = M1.x[1][0];
  fVar59 = M1.x[1][1];
  fVar45 = M1.x[0][0];
  fVar51 = M1.x[0][1];
  fVar44 = M1.x[2][0];
  fVar24 = M1.x[2][1];
  fVar60 = M1.x[3][0];
  auVar56._0_4_ = fVar45 + fVar58 * 0.0 + fVar44 * 0.0 + fVar60;
  fVar64 = M1.x[3][1];
  auVar56._4_4_ = fVar51 + fVar59 * 0.0 + fVar24 * 0.0 + fVar64;
  auVar56._8_8_ = 0;
  auVar57._4_4_ = fVar55;
  auVar57._0_4_ = fVar55;
  auVar57._8_8_ = 0;
  auVar57 = divps(auVar56,auVar57);
  filename._M_dataplus._M_p = auVar57._0_8_;
  fVar55 = M1.x[0][3] * 0.0 + M1.x[1][3] + M1.x[2][3] * 0.0 + M1.x[3][3];
  out._outputFile._0_4_ = (M1.x[0][2] * 0.0 + M1.x[1][2] + M1.x[2][2] * 0.0 + M1.x[3][2]) / fVar55;
  auVar52._0_4_ = fVar45 * 0.0 + fVar58 + fVar44 * 0.0 + fVar60;
  auVar52._4_4_ = fVar51 * 0.0 + fVar59 + fVar24 * 0.0 + fVar64;
  auVar52._8_8_ = 0;
  auVar4._4_4_ = fVar55;
  auVar4._0_4_ = fVar55;
  auVar4._8_8_ = 0;
  auVar57 = divps(auVar52,auVar4);
  out._vptr_RgbaOutputFile = auVar57._0_8_;
  auVar53._0_4_ = M1.x[0][3] * 0.0 + M1.x[1][3] * 0.0 + M1.x[2][3] + M1.x[3][3];
  fVar55 = (M1.x[0][2] * 0.0 + M1.x[1][2] * 0.0 + M1.x[2][2] + M1.x[3][2]) / auVar53._0_4_;
  auVar67._0_4_ = fVar45 * 0.0 + fVar58 * 0.0 + fVar44 + fVar60;
  auVar67._4_4_ = fVar51 * 0.0 + fVar59 * 0.0 + fVar24 + fVar64;
  auVar67._8_8_ = 0;
  auVar53._4_4_ = auVar53._0_4_;
  auVar53._8_8_ = 0;
  auVar57 = divps(auVar67,auVar53);
  r9 = auVar57._0_8_;
  auVar30._0_4_ = M1.x[0][3] + M1.x[1][3] + M1.x[2][3] + M1.x[3][3];
  auVar25._0_4_ = fVar45 + fVar58 + fVar44 + fVar60;
  auVar25._4_4_ = fVar51 + fVar59 + fVar24 + fVar64;
  auVar25._8_8_ = 0;
  fVar45 = (M1.x[0][2] + M1.x[1][2] + M1.x[2][2] + M1.x[3][2]) / auVar30._0_4_;
  auVar30._4_4_ = auVar30._0_4_;
  auVar30._8_8_ = 0;
  auVar57 = divps(auVar25,auVar30);
  pos = auVar57._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   XYZ = ",0xc);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&filename);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green XYZ = ",0xc);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  XYZ = ",0xc);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&r9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white XYZ = ",0xc);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&pos);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  auVar26._8_8_ = 0;
  auVar26._0_8_ = filename._M_dataplus._M_p;
  fVar24 = (float)((ulong)filename._M_dataplus._M_p >> 0x20);
  auVar31._4_4_ = fVar24;
  auVar31._0_4_ = fVar24;
  auVar31._8_4_ = fVar24;
  auVar31._12_4_ = fVar24;
  auVar32._4_12_ = auVar31._4_12_;
  auVar32._0_4_ = fVar24 + SUB84(filename._M_dataplus._M_p,0) + (float)filename._M_string_length;
  auVar34._0_8_ = auVar32._0_8_;
  auVar34._8_4_ = fVar24;
  auVar34._12_4_ = fVar24;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._4_4_ = auVar32._0_4_;
  auVar33._0_4_ = auVar32._0_4_;
  auVar57 = divps(auVar26,auVar33);
  _face = auVar57._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = out._vptr_RgbaOutputFile;
  fVar24 = (float)((ulong)out._vptr_RgbaOutputFile >> 0x20);
  auVar35._4_4_ = fVar24;
  auVar35._0_4_ = fVar24;
  auVar35._8_4_ = fVar24;
  auVar35._12_4_ = fVar24;
  auVar36._4_12_ = auVar35._4_12_;
  auVar36._0_4_ = fVar24 + SUB84(out._vptr_RgbaOutputFile,0) + out._outputFile._0_4_;
  auVar38._0_8_ = auVar36._0_8_;
  auVar38._8_4_ = fVar24;
  auVar38._12_4_ = fVar24;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._4_4_ = auVar36._0_4_;
  auVar37._0_4_ = auVar36._0_4_;
  auVar57 = divps(auVar27,auVar37);
  _face_2 = auVar57._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_4_ = r9.n;
  auVar28._4_4_ = r9.d;
  fVar24 = (float)r9.d;
  auVar39._4_4_ = fVar24;
  auVar39._0_4_ = fVar24;
  auVar39._8_4_ = fVar24;
  auVar39._12_4_ = fVar24;
  auVar40._4_12_ = auVar39._4_12_;
  auVar40._0_4_ = fVar24 + (float)r9.n + fVar55;
  auVar42._0_8_ = auVar40._0_8_;
  auVar42._8_4_ = fVar24;
  auVar42._12_4_ = fVar24;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._4_4_ = auVar40._0_4_;
  auVar41._0_4_ = auVar40._0_4_;
  auVar57 = divps(auVar28,auVar41);
  auVar43._8_8_ = 0;
  auVar43._0_4_ = pos.x;
  auVar43._4_4_ = pos.y;
  fVar24 = pos.y;
  auVar46._4_4_ = fVar24;
  auVar46._0_4_ = fVar24;
  auVar46._8_4_ = fVar24;
  auVar46._12_4_ = fVar24;
  auVar47._4_12_ = auVar46._4_12_;
  auVar47._0_4_ = fVar24 + pos.x + fVar45;
  local_360 = auVar57._0_8_;
  auVar49._0_8_ = auVar47._0_8_;
  auVar49._8_4_ = fVar24;
  auVar49._12_4_ = fVar24;
  auVar48._8_8_ = auVar49._8_8_;
  auVar48._4_4_ = auVar47._0_4_;
  auVar48._0_4_ = auVar47._0_4_;
  auVar57 = divps(auVar43,auVar48);
  local_368 = auVar57._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   xy = ",0xb);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec2<float> *)&face);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green xy = ",0xb);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec2<float> *)&face_2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  xy = ",0xb);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec2<float> *)local_360);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white xy = ",0xb);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec2<float> *)local_368);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  fVar24 = pos.y;
  if (pos.y <= -pos.y) {
    fVar24 = -pos.y;
  }
  if (fVar24 * 1e-05 <
      (float)(-(uint)(100.0 < pos.y) & (uint)(pos.y + -100.0) |
             ~-(uint)(100.0 < pos.y) & (uint)(100.0 - pos.y))) {
    __assert_fail("equalWithRelError (W1.y, Y, 1e-5F)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x55,"void (anonymous namespace)::convertRGBtoXYZ()");
  }
  bVar7 = true;
  pVVar20 = (Vec2<float> *)&face;
  pCVar13 = &c;
  do {
    fVar24 = pVVar20->x;
    fVar51 = (pCVar13->red).x;
    fVar24 = (float)(~-(uint)(fVar51 < fVar24) & (uint)(fVar51 - fVar24) |
                    (uint)(fVar24 - fVar51) & -(uint)(fVar51 < fVar24));
    if (!bVar7) break;
    bVar7 = false;
    pVVar20 = (Vec2<float> *)auStack_484;
    pCVar13 = (Chromaticities *)&c.red.y;
  } while (fVar24 <= 1e-05);
  if (1e-05 < fVar24) {
    __assert_fail("r1.equalWithAbsError (c.red, 1e-5F)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x56,"void (anonymous namespace)::convertRGBtoXYZ()");
  }
  bVar7 = true;
  lVar23 = 0;
  pVVar20 = (Vec2<float> *)&face_2;
  do {
    fVar24 = pVVar20->x;
    fVar51 = (&c.green.x)[lVar23];
    fVar24 = (float)(~-(uint)(fVar51 < fVar24) & (uint)(fVar51 - fVar24) |
                    (uint)(fVar24 - fVar51) & -(uint)(fVar51 < fVar24));
    if (!bVar7) break;
    lVar23 = 1;
    bVar7 = false;
    pVVar20 = (Vec2<float> *)auStack_3cc;
  } while (fVar24 <= 1e-05);
  if (1e-05 < fVar24) {
    __assert_fail("g1.equalWithAbsError (c.green, 1e-5F)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x57,"void (anonymous namespace)::convertRGBtoXYZ()");
  }
  bVar7 = true;
  lVar23 = 0;
  pVVar20 = (Vec2<float> *)local_360;
  do {
    fVar24 = pVVar20->x;
    fVar51 = (&c.blue.x)[lVar23];
    fVar24 = (float)(~-(uint)(fVar51 < fVar24) & (uint)(fVar51 - fVar24) |
                    (uint)(fVar24 - fVar51) & -(uint)(fVar51 < fVar24));
    if (!bVar7) break;
    lVar23 = 1;
    bVar7 = false;
    pVVar20 = (Vec2<float> *)(local_360 + 4);
  } while (fVar24 <= 1e-05);
  if (1e-05 < fVar24) {
    __assert_fail("b1.equalWithAbsError (c.blue, 1e-5F)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x58,"void (anonymous namespace)::convertRGBtoXYZ()");
  }
  bVar7 = true;
  lVar23 = 0;
  pVVar20 = (Vec2<float> *)local_368;
  do {
    fVar24 = pVVar20->x;
    fVar51 = (&c.white.x)[lVar23];
    fVar24 = (float)(~-(uint)(fVar51 < fVar24) & (uint)(fVar51 - fVar24) |
                    (uint)(fVar24 - fVar51) & -(uint)(fVar51 < fVar24));
    if (!bVar7) break;
    lVar23 = 1;
    bVar7 = false;
    pVVar20 = (Vec2<float> *)(local_368 + 4);
  } while (fVar24 <= 1e-05);
  if (1e-05 < fVar24) {
    __assert_fail("w1.equalWithAbsError (c.white, 1e-5F)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x59,"void (anonymous namespace)::convertRGBtoXYZ()");
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"conversion from XYZ to RGB",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  Imf_2_5::XYZtoRGB(&M2,&c,100.0);
  auVar65._0_4_ =
       (float)filename._M_string_length * M2.x[2][3] +
       filename._M_dataplus._M_p._0_4_ * M2.x[0][3] + filename._M_dataplus._M_p._4_4_ * M2.x[1][3] +
       M2.x[3][3];
  fVar44 = M2.x[1][0];
  fVar58 = M2.x[1][1];
  fVar24 = M2.x[2][0];
  fVar51 = M2.x[2][1];
  fVar59 = M2.x[3][0];
  auVar61._0_4_ =
       (float)filename._M_string_length * fVar24 +
       filename._M_dataplus._M_p._0_4_ * M2.x[0][0] + filename._M_dataplus._M_p._4_4_ * fVar44 +
       fVar59;
  fVar60 = M2.x[3][1];
  auVar61._4_4_ =
       (float)filename._M_string_length * fVar51 +
       filename._M_dataplus._M_p._0_4_ * M2.x[0][1] + filename._M_dataplus._M_p._4_4_ * fVar58 +
       fVar60;
  auVar61._8_4_ =
       filename._M_dataplus._M_p._0_4_ * 0.0 + filename._M_dataplus._M_p._4_4_ * 0.0 + 0.0 + 0.0;
  auVar61._12_4_ =
       filename._M_dataplus._M_p._0_4_ * 0.0 + filename._M_dataplus._M_p._4_4_ * 0.0 + 0.0 + 0.0;
  auVar65._4_4_ = auVar65._0_4_;
  auVar65._8_8_ = 0;
  auVar57 = divps(auVar61,auVar65);
  _rand = auVar57._0_8_;
  auVar62._0_4_ =
       out._outputFile._0_4_ * M2.x[2][3] +
       out._vptr_RgbaOutputFile._0_4_ * M2.x[0][3] + M2.x[1][3] * out._vptr_RgbaOutputFile._4_4_ +
       M2.x[3][3];
  auVar66._0_4_ =
       out._outputFile._0_4_ * fVar24 +
       out._vptr_RgbaOutputFile._0_4_ * M2.x[0][0] + out._vptr_RgbaOutputFile._4_4_ * fVar44 +
       fVar59;
  auVar66._4_4_ =
       out._outputFile._0_4_ * fVar51 +
       out._vptr_RgbaOutputFile._0_4_ * M2.x[0][1] + out._vptr_RgbaOutputFile._4_4_ * fVar58 +
       fVar60;
  auVar66._8_4_ =
       out._vptr_RgbaOutputFile._0_4_ * 0.0 + out._vptr_RgbaOutputFile._4_4_ * 0.0 + 0.0 + 0.0;
  auVar66._12_4_ =
       out._vptr_RgbaOutputFile._0_4_ * 0.0 + out._vptr_RgbaOutputFile._4_4_ * 0.0 + 0.0 + 0.0;
  auVar62._4_4_ = auVar62._0_4_;
  auVar62._8_8_ = 0;
  auVar57 = divps(auVar66,auVar62);
  pif = auVar57._0_8_;
  auVar29._0_4_ =
       fVar55 * M2.x[2][3] + (float)r9.n * M2.x[0][3] + M2.x[1][3] * (float)r9.d + M2.x[3][3];
  auVar63._0_4_ = fVar55 * fVar24 + (float)r9.n * M2.x[0][0] + (float)r9.d * fVar44 + fVar59;
  auVar63._4_4_ = fVar55 * fVar51 + (float)r9.n * M2.x[0][1] + (float)r9.d * fVar58 + fVar60;
  auVar63._8_4_ = (float)r9.n * 0.0 + (float)r9.d * 0.0 + 0.0 + 0.0;
  auVar63._12_4_ = (float)r9.n * 0.0 + (float)r9.d * 0.0 + 0.0 + 0.0;
  auVar29._4_4_ = auVar29._0_4_;
  auVar29._8_8_ = 0;
  auVar57 = divps(auVar63,auVar29);
  pos_2 = auVar57._0_8_;
  auVar50._0_4_ = M2.x[2][3] * fVar45 + M2.x[0][3] * pos.x + M2.x[1][3] * pos.y + M2.x[3][3];
  auVar54._0_4_ = fVar45 * fVar24 + pos.x * M2.x[0][0] + pos.y * fVar44 + fVar59;
  auVar54._4_4_ = fVar45 * fVar51 + pos.x * M2.x[0][1] + pos.y * fVar58 + fVar60;
  auVar54._8_4_ = pos.x * 0.0 + pos.y * 0.0 + 0.0 + 0.0;
  auVar54._12_4_ = pos.x * 0.0 + pos.y * 0.0 + 0.0 + 0.0;
  local_3b8.z = (M2.x[2][2] * fVar45 + M2.x[0][2] * pos.x + M2.x[1][2] * pos.y + M2.x[3][2]) /
                auVar50._0_4_;
  auVar50._4_4_ = auVar50._0_4_;
  auVar50._8_8_ = 0;
  auVar57 = divps(auVar54,auVar50);
  local_3b8._0_8_ = auVar57._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   RGB = ",0xc);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&rand);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green RGB = ",0xc);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&pif);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  RGB = ",0xc);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,(Vec3<float> *)&pos_2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white RGB = ",0xc);
  poVar11 = Imath_2_5::operator<<((ostream *)&std::cout,&local_3b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  _rand_1 = 0x3f800000;
  if ((float)(-(uint)(1.0 < (float)rand._state._0_4_) & (uint)((float)rand._state._0_4_ + -1.0) |
             ~-(uint)(1.0 < (float)rand._state._0_4_) & (uint)(1.0 - (float)rand._state._0_4_)) <=
      0.001) {
    lVar23 = 1;
    do {
      lVar22 = lVar23;
      if (lVar22 == 3) goto LAB_00196981;
      fVar24 = *(float *)(rand._state + lVar22 * 2);
      fVar45 = *(float *)(rand_1._state + lVar22 * 2);
      lVar23 = lVar22 + 1;
    } while ((float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                    (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24)) <= 0.001);
    if (1 < lVar22 - 1U) {
LAB_00196981:
      _rand_1 = 0x3f80000000000000;
      if (ABS(pif.x) <= 0.001) {
        lVar23 = 1;
        do {
          lVar22 = lVar23;
          if (lVar22 == 3) goto LAB_00196a05;
          fVar24 = (&pif.x)[lVar22];
          fVar45 = *(float *)(rand_1._state + lVar22 * 2);
          lVar23 = lVar22 + 1;
        } while ((float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                        (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24)) <= 0.001);
        if (1 < lVar22 - 1U) {
LAB_00196a05:
          _rand_1 = 0;
          if (ABS(pos_2.x) <= 0.001) {
            lVar23 = 1;
            do {
              lVar22 = lVar23;
              if (lVar22 == 3) goto LAB_00196a84;
              fVar24 = (&pos_2.x)[lVar22];
              fVar45 = *(float *)(rand_1._state + lVar22 * 2);
              lVar23 = lVar22 + 1;
            } while ((float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                            (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24)) <= 0.001);
            if (1 < lVar22 - 1U) {
LAB_00196a84:
              _rand_1 = 0x3f8000003f800000;
              if ((float)(-(uint)(1.0 < local_3b8.x) & (uint)(local_3b8.x + -1.0) |
                         ~-(uint)(1.0 < local_3b8.x) & (uint)(1.0 - local_3b8.x)) <= 0.001) {
                lVar23 = 1;
                do {
                  lVar22 = lVar23;
                  if (lVar22 == 3) goto LAB_00196b25;
                  fVar24 = (&local_3b8.x)[lVar22];
                  fVar45 = *(float *)(rand_1._state + lVar22 * 2);
                  lVar23 = lVar22 + 1;
                } while ((float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                                (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24)) <= 0.001);
                if (1 < lVar22 - 1U) {
LAB_00196b25:
                  pcVar3 = (tempDir->_M_dataplus)._M_p;
                  filename._M_dataplus._M_p = (pointer)&filename.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&filename,pcVar3,pcVar3 + tempDir->_M_string_length);
                  std::__cxx11::string::append((char *)&filename);
                  name = filename._M_dataplus;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"chromaticities attribute",0x18);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                  std::ostream::put('p');
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"writing, ",9);
                  M1.x[0][0] = 1.0;
                  M1.x[0][1] = 2.0;
                  M2.x[0][0] = 3.0;
                  M2.x[0][1] = 4.0;
                  out._vptr_RgbaOutputFile = (_func_int **)0x40c0000040a00000;
                  r9.n = 0x40e00000;
                  r9.d = 0x41000000;
                  Imf_2_5::Chromaticities::Chromaticities
                            (&c,(V2f *)&M1,(V2f *)&M2,(V2f *)&out,(V2f *)&r9);
                  M1.x[0][0] = 0.0;
                  M1.x[0][1] = 0.0;
                  Imf_2_5::Header::Header
                            ((Header *)&M2,100,100,1.0,(V2f *)&M1,1.0,INCREASING_Y,ZIP_COMPRESSION);
                  bVar7 = Imf_2_5::hasChromaticities((Header *)&M2);
                  if (bVar7) {
                    __assert_fail("hasChromaticities (header) == false",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                  ,0x7c,
                                  "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                 );
                  }
                  Imf_2_5::addChromaticities((Header *)&M2,&c);
                  bVar7 = Imf_2_5::hasChromaticities((Header *)&M2);
                  if (!bVar7) {
                    __assert_fail("hasChromaticities (header) == true",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                  ,0x7f,
                                  "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                 );
                  }
                  iVar9 = Imf_2_5::globalThreadCount();
                  Imf_2_5::RgbaOutputFile::RgbaOutputFile
                            (&out,name._M_p,(Header *)&M2,WRITE_RGBA,iVar9);
                  lVar23 = 0;
                  do {
                    *(unsigned_short *)(M1.x[0] + lVar23 * 2) = 0x3c00;
                    *(unsigned_short *)((long)M1.x[0] + lVar23 * 8 + 2) = 0x3c00;
                    *(unsigned_short *)(M1.x[0] + lVar23 * 2 + 1) = 0x3c00;
                    *(unsigned_short *)((long)M1.x[0] + lVar23 * 8 + 6) = 0x3c00;
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != 100);
                  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,(Rgba *)&M1,1,0);
                  Imf_2_5::RgbaOutputFile::writePixels(&out,100);
                  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"reading, comparing",0x12);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                  std::ostream::put('p');
                  std::ostream::flush();
                  iVar9 = Imf_2_5::globalThreadCount();
                  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&M1,name._M_p,iVar9);
                  pHVar12 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                  pCVar13 = Imf_2_5::chromaticities(pHVar12);
                  pHVar12 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                  bVar7 = Imf_2_5::hasChromaticities(pHVar12);
                  if (!bVar7) {
                    __assert_fail("hasChromaticities (in.header()) == true",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                  ,0x97,
                                  "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                 );
                  }
                  if ((c.red.x == (pCVar13->red).x) && (!NAN(c.red.x) && !NAN((pCVar13->red).x))) {
                    pfVar1 = &(pCVar13->red).y;
                    if ((c.red.y == *pfVar1) && (!NAN(c.red.y) && !NAN(*pfVar1))) {
                      if ((((c.green.x != (pCVar13->green).x) ||
                           (NAN(c.green.x) || NAN((pCVar13->green).x))) ||
                          (pfVar1 = &(pCVar13->green).y, c.green.y != *pfVar1)) ||
                         (NAN(c.green.y) || NAN(*pfVar1))) {
                        __assert_fail("c1.green == c2.green",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x99,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      if (((c.blue.x != (pCVar13->blue).x) ||
                          (NAN(c.blue.x) || NAN((pCVar13->blue).x))) ||
                         ((pfVar1 = &(pCVar13->blue).y, c.blue.y != *pfVar1 ||
                          (NAN(c.blue.y) || NAN(*pfVar1))))) {
                        __assert_fail("c1.blue == c2.blue",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x9a,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      if (((c.white.x != (pCVar13->white).x) ||
                          (NAN(c.white.x) || NAN((pCVar13->white).x))) ||
                         ((pfVar1 = &(pCVar13->white).y, c.white.y != *pfVar1 ||
                          (NAN(c.white.y) || NAN(*pfVar1))))) {
                        __assert_fail("c1.white == c2.white",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x9b,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                      remove(name._M_p);
                      Imf_2_5::Header::~Header((Header *)&M2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)filename._M_dataplus._M_p != &filename.field_2) {
                        operator_delete(filename._M_dataplus._M_p,
                                        filename.field_2._M_allocated_capacity + 1);
                      }
                      M2.x[0]._0_8_ = M2.x + 1;
                      pcVar3 = (tempDir->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&M2,pcVar3,pcVar3 + tempDir->_M_string_length);
                      std::__cxx11::string::append((char *)&M2);
                      c.red = (V2f)&c.blue;
                      pcVar3 = (tempDir->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&c,pcVar3,pcVar3 + tempDir->_M_string_length);
                      std::__cxx11::string::append((char *)&c);
                      uVar6 = M2.x[0]._0_8_;
                      VVar5 = c.red;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"latitude-longitude environment map",0x22);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                      std::ostream::put('p');
                      std::ostream::flush();
                      filename._M_dataplus._M_p = (pointer)0x0;
                      Imf_2_5::Header::Header
                                ((Header *)&M1,0x168,0xb4,1.0,(V2f *)&filename,1.0,INCREASING_Y,
                                 ZIP_COMPRESSION);
                      filename._M_dataplus._M_p = filename._M_dataplus._M_p & 0xffffffff00000000;
                      Imf_2_5::addEnvmap((Header *)&M1,(Envmap *)&filename);
                      filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                      filename._M_string_length._0_4_ = 0.0;
                      Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                      if (1e-06 < (float)(-(uint)(1.5707964 < out._vptr_RgbaOutputFile._0_4_) &
                                          (uint)(out._vptr_RgbaOutputFile._0_4_ + -1.5707964) |
                                         ~-(uint)(1.5707964 < out._vptr_RgbaOutputFile._0_4_) &
                                         (uint)(1.5707964 - out._vptr_RgbaOutputFile._0_4_))) {
                        __assert_fail("equalWithAbsError (pos.x, float (M_PI/2), 1e-6f)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0xaf,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                      filename._M_string_length._0_4_ = 0.0;
                      Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                      if (1e-06 < (float)(-(uint)(-1.5707964 < out._vptr_RgbaOutputFile._0_4_) &
                                          (uint)(out._vptr_RgbaOutputFile._0_4_ + 1.5707964) |
                                         ~-(uint)(-1.5707964 < out._vptr_RgbaOutputFile._0_4_) &
                                         (uint)(-1.5707964 - out._vptr_RgbaOutputFile._0_4_))) {
                        __assert_fail("equalWithAbsError (pos.x, float (-M_PI/2), 1e-6f)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0xb2,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0x0;
                      filename._M_string_length._0_4_ = 1.0;
                      Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                      bVar7 = true;
                      fVar24 = out._vptr_RgbaOutputFile._0_4_;
                      do {
                        fVar45 = ABS(fVar24);
                        if (!bVar7) break;
                        bVar7 = false;
                        fVar24 = out._vptr_RgbaOutputFile._4_4_;
                      } while (fVar45 <= 1e-06);
                      if (1e-06 < fVar45) {
                        __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0xb5,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0x3f800000;
                      filename._M_string_length._0_4_ = 0.0;
                      Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                      fVar45 = 0.0;
                      bVar7 = true;
                      fVar24 = out._vptr_RgbaOutputFile._0_4_;
                      do {
                        fVar51 = (float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                                        (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        fVar45 = 1.5707964;
                        fVar24 = out._vptr_RgbaOutputFile._4_4_;
                      } while (fVar51 <= 1e-06);
                      if (1e-06 < fVar51) {
                        __assert_fail("pos.equalWithAbsError (V2f (0, M_PI/2), 1e-6f)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0xb8,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0xbf800000;
                      filename._M_string_length._0_4_ = 0.0;
                      Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                      fVar45 = 0.0;
                      bVar7 = true;
                      fVar24 = out._vptr_RgbaOutputFile._0_4_;
                      do {
                        fVar51 = (float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                                        (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        fVar45 = -1.5707964;
                        fVar24 = out._vptr_RgbaOutputFile._4_4_;
                      } while (fVar51 <= 1e-06);
                      if (1e-06 < fVar51) {
                        __assert_fail("pos.equalWithAbsError (V2f (0, -M_PI/2), 1e-6f)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0xbb,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                      filename._M_string_length._0_4_ = 1.0;
                      Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                      fVar45 = 0.7853982;
                      bVar7 = true;
                      fVar24 = out._vptr_RgbaOutputFile._0_4_;
                      do {
                        fVar51 = (float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                                        (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24));
                        if (!bVar7) break;
                        fVar45 = 0.0;
                        bVar7 = false;
                        fVar24 = out._vptr_RgbaOutputFile._4_4_;
                      } while (fVar51 <= 1e-06);
                      if (1e-06 < fVar51) {
                        __assert_fail("pos.equalWithAbsError (V2f (M_PI/4, 0), 1e-6f)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0xbe,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                      filename._M_string_length._0_4_ = 1.0;
                      Imf_2_5::LatLongMap::latLong((LatLongMap *)&out,(V3f *)&filename);
                      fVar45 = -0.7853982;
                      bVar7 = true;
                      fVar24 = out._vptr_RgbaOutputFile._0_4_;
                      do {
                        fVar51 = (float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                                        (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24));
                        if (!bVar7) break;
                        fVar45 = 0.0;
                        bVar7 = false;
                        fVar24 = out._vptr_RgbaOutputFile._4_4_;
                      } while (fVar51 <= 1e-06);
                      if (1e-06 < fVar51) {
                        __assert_fail("pos.equalWithAbsError (V2f (-M_PI/4, 0), 1e-6f)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0xc1,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      out._vptr_RgbaOutputFile = (_func_int **)0x40490fdb3fc90fdb;
                      Imf_2_5::LatLongMap::pixelPosition(pBVar14,(V2f *)&out);
                      bVar7 = true;
                      fVar24 = filename._M_dataplus._M_p._0_4_;
                      do {
                        fVar45 = ABS(fVar24);
                        if (!bVar7) break;
                        bVar7 = false;
                        fVar24 = filename._M_dataplus._M_p._4_4_;
                      } while (fVar45 <= 0.00036);
                      if (0.00036 < fVar45) {
                        __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f * W)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0xc4,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      out._vptr_RgbaOutputFile = (_func_int **)0xc0490fdbbfc90fdb;
                      Imf_2_5::LatLongMap::pixelPosition(pBVar14,(V2f *)&out);
                      fVar24 = filename._M_dataplus._M_p._0_4_;
                      fVar45 = filename._M_dataplus._M_p._4_4_;
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      bVar7 = true;
                      iVar9 = (pBVar14->max).x;
                      do {
                        fVar51 = (float)iVar9;
                        fVar51 = (float)(~-(uint)(fVar51 < fVar24) & (uint)(fVar51 - fVar24) |
                                        (uint)(fVar24 - fVar51) & -(uint)(fVar51 < fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        iVar9 = (pBVar14->max).y;
                        fVar24 = fVar45;
                      } while (fVar51 <= 0.00036);
                      if (0.00036 < fVar51) {
                        __assert_fail("pos.equalWithAbsError (V2f (header.dataWindow().max), 1e-6f * W)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,199,
                                      "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                     );
                      }
                      pRVar15 = (Rgba *)operator_new__(0x7e900);
                      phVar16 = &pRVar15->b;
                      lVar23 = 0;
                      do {
                        lVar22 = 0;
                        do {
                          pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                          out._vptr_RgbaOutputFile =
                               (_func_int **)CONCAT44((float)(int)lVar23,(float)(int)lVar22);
                          Imf_2_5::LatLongMap::direction
                                    ((LatLongMap *)&filename,pBVar14,(V2f *)&out);
                          fVar24 = filename._M_dataplus._M_p._0_4_ + 1.0;
                          if ((fVar24 != 0.0) || (NAN(fVar24))) {
                            if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                              uVar8 = half::convert((int)fVar24);
                            }
                            else {
                              uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                      (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                              (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                            }
                          }
                          else {
                            uVar8 = 0;
                          }
                          phVar16[lVar22 * 4 + -2]._h = uVar8;
                          fVar24 = filename._M_dataplus._M_p._4_4_ + 1.0;
                          if ((fVar24 != 0.0) || (NAN(fVar24))) {
                            if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                              uVar8 = half::convert((int)fVar24);
                            }
                            else {
                              uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                      (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                              (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                            }
                          }
                          else {
                            uVar8 = 0;
                          }
                          phVar16[lVar22 * 4 + -1]._h = uVar8;
                          fVar24 = (float)filename._M_string_length + 1.0;
                          if ((fVar24 != 0.0) || (NAN(fVar24))) {
                            if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                              uVar8 = half::convert((int)fVar24);
                            }
                            else {
                              uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                      (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                              (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                            }
                          }
                          else {
                            uVar8 = 0;
                          }
                          phVar16[lVar22 * 4]._h = uVar8;
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 0x168);
                        lVar23 = lVar23 + 1;
                        phVar16 = phVar16 + 0x5a0;
                      } while (lVar23 != 0xb4);
                      iVar9 = Imf_2_5::globalThreadCount();
                      Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                ((RgbaOutputFile *)&filename,(char *)uVar6,(Header *)&M1,WRITE_RGB,
                                 iVar9);
                      Imf_2_5::RgbaOutputFile::setFrameBuffer
                                ((RgbaOutputFile *)&filename,pRVar15,1,0x168);
                      Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&filename,0xb4);
                      Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&filename);
                      rand._state[0] = 0x5a5a;
                      rand._state[1] = 0x5a5a;
                      rand._state[2] = 0x5a5a;
                      iVar9 = 0;
                      do {
                        Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>
                                  ((Imath_2_5 *)&filename,&rand);
                        pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::LatLongMap::pixelPosition
                                  ((LatLongMap *)&pos,pBVar14,(V3f *)&filename);
                        fVar51 = pos.y;
                        fVar45 = pos.x;
                        fVar24 = (filename._M_dataplus._M_p._0_4_ + 1.0) * 0.8;
                        if ((fVar24 != 0.0) || (NAN(fVar24))) {
                          if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                            uVar8 = half::convert((int)fVar24);
                          }
                          else {
                            uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                    (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                            (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else {
                          uVar8 = (unsigned_short)((uint)fVar24 >> 0x10);
                        }
                        iVar17 = (int)(fVar51 + 0.5);
                        lVar23 = (long)(int)(fVar45 + 0.5);
                        fVar24 = (filename._M_dataplus._M_p._4_4_ + 1.0) * 0.8;
                        pRVar15[(long)iVar17 * 0x168 + lVar23].r._h = uVar8;
                        if ((fVar24 != 0.0) || (NAN(fVar24))) {
                          if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                            uVar8 = half::convert((int)fVar24);
                          }
                          else {
                            uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                    (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                            (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else {
                          uVar8 = (unsigned_short)((uint)fVar24 >> 0x10);
                        }
                        fVar24 = ((float)filename._M_string_length + 1.0) * 0.8;
                        pRVar15[(long)iVar17 * 0x168 + lVar23].g._h = uVar8;
                        if ((fVar24 != 0.0) || (NAN(fVar24))) {
                          if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                            uVar8 = half::convert((int)fVar24);
                          }
                          else {
                            uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                    (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                            (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else {
                          uVar8 = (unsigned_short)((uint)fVar24 >> 0x10);
                        }
                        pRVar15[(long)iVar17 * 0x168 + lVar23].b._h = uVar8;
                        pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::LatLongMap::direction((LatLongMap *)&out,pBVar14,&pos);
                        Imath_2_5::Vec3<float>::normalized((Vec3<float> *)&r9);
                        if (1e-05 < (float)(~-(uint)((float)r9.n < filename._M_dataplus._M_p._0_4_)
                                            & (uint)((float)r9.n - filename._M_dataplus._M_p._0_4_)
                                           | (uint)(filename._M_dataplus._M_p._0_4_ - (float)r9.n) &
                                             -(uint)((float)r9.n < filename._M_dataplus._M_p._0_4_))
                           ) {
LAB_0019a689:
                          __assert_fail("dir.equalWithAbsError (dir1.normalized(), 1e-5f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0xec,
                                        "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                       );
                        }
                        lVar23 = 1;
                        do {
                          lVar22 = lVar23;
                          if (lVar22 == 3) goto LAB_0019790a;
                          fVar24 = *(float *)((long)&filename._M_dataplus._M_p + lVar22 * 4);
                          fVar45 = (float)(&r9.n)[lVar22];
                          lVar23 = lVar22 + 1;
                        } while ((float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                                        (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24)) <= 1e-05
                                );
                        if (lVar22 - 1U < 2) goto LAB_0019a689;
LAB_0019790a:
                        iVar9 = iVar9 + 1;
                      } while (iVar9 != 0x2f760);
                      iVar9 = Imf_2_5::globalThreadCount();
                      Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                ((RgbaOutputFile *)&filename,(char *)VVar5,(Header *)&M1,WRITE_RGB,
                                 iVar9);
                      Imf_2_5::RgbaOutputFile::setFrameBuffer
                                ((RgbaOutputFile *)&filename,pRVar15,1,0x168);
                      Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&filename,0xb4);
                      Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&filename);
                      remove((char *)uVar6);
                      remove((char *)VVar5);
                      operator_delete__(pRVar15);
                      Imf_2_5::Header::~Header((Header *)&M1);
                      if (c.red != (V2f)&c.blue) {
                        operator_delete((void *)c.red,CONCAT44(c.blue.y,c.blue.x) + 1);
                      }
                      if ((float (*) [4])M2.x[0]._0_8_ != M2.x + 1) {
                        operator_delete((void *)M2.x[0]._0_8_,M2.x[1]._0_8_ + 1);
                      }
                      M2.x[0]._0_8_ = M2.x + 1;
                      pcVar3 = (tempDir->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&M2,pcVar3,pcVar3 + tempDir->_M_string_length);
                      std::__cxx11::string::append((char *)&M2);
                      c.red = (V2f)&c.blue;
                      pcVar3 = (tempDir->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&c,pcVar3,pcVar3 + tempDir->_M_string_length);
                      std::__cxx11::string::append((char *)&c);
                      uVar6 = M2.x[0]._0_8_;
                      VVar5 = c.red;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"cube environment map",0x14);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                      std::ostream::put('p');
                      std::ostream::flush();
                      filename._M_dataplus._M_p = (pointer)0x0;
                      Imf_2_5::Header::Header
                                ((Header *)&M1,0x80,0x300,1.0,(V2f *)&filename,1.0,INCREASING_Y,
                                 ZIP_COMPRESSION);
                      filename._M_dataplus._M_p._0_4_ = 1.4013e-45;
                      Imf_2_5::addEnvmap((Header *)&M1,(Envmap *)&filename);
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      iVar9 = Imf_2_5::CubeMap::sizeOfFace(pBVar14);
                      if (iVar9 != 0x80) {
                        __assert_fail("sof == N",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x108,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      pfVar1 = &pos.y;
                      CVar19 = CUBEFACE_POS_X;
                      do {
                        pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::dataWindowForFace((CubeMap *)&filename,CVar19,pBVar14);
                        if ((int)(float)filename._M_string_length -
                            (int)filename._M_dataplus._M_p._0_4_ != 0x7f) {
                          __assert_fail("dw1.max.x - dw1.min.x == sof - 1",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x10f,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        if (filename._M_string_length._4_4_ - (int)filename._M_dataplus._M_p._4_4_
                            != 0x7f) {
                          __assert_fail("dw1.max.y - dw1.min.y == sof - 1",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x110,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        if (((((int)filename._M_dataplus._M_p._0_4_ < (pBVar14->min).x) ||
                             ((pBVar14->max).x < (int)filename._M_dataplus._M_p._0_4_)) ||
                            ((int)filename._M_dataplus._M_p._4_4_ < (pBVar14->min).y)) ||
                           ((pBVar14->max).y < (int)filename._M_dataplus._M_p._4_4_)) {
                          __assert_fail("header.dataWindow().intersects (dw1.min)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x111,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        if ((((int)(float)filename._M_string_length < (pBVar14->min).x) ||
                            ((pBVar14->max).x < (int)(float)filename._M_string_length)) ||
                           ((filename._M_string_length._4_4_ < (pBVar14->min).y ||
                            ((pBVar14->max).y < filename._M_string_length._4_4_)))) {
                          __assert_fail("header.dataWindow().intersects (dw1.max)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x112,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                        CVar2 = CVar19 + CUBEFACE_NEG_X;
                        face_00 = CVar2;
                        if (CVar19 < CUBEFACE_NEG_Z) {
                          do {
                            pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                            Imf_2_5::CubeMap::dataWindowForFace((CubeMap *)&out,face_00,pBVar14);
                            if ((((int)filename._M_dataplus._M_p._0_4_ <= (int)out._outputFile._0_4_
                                 ) && ((int)out._vptr_RgbaOutputFile._0_4_ <=
                                       (int)(float)filename._M_string_length)) &&
                               (((int)filename._M_dataplus._M_p._4_4_ <= out._outputFile._4_4_ &&
                                ((int)out._vptr_RgbaOutputFile._4_4_ <=
                                 filename._M_string_length._4_4_)))) {
                              __assert_fail("!dw1.intersects (dw2)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                            ,0x118,
                                            "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                           );
                            }
                            face_00 = face_00 + CUBEFACE_NEG_X;
                          } while (face_00 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y));
                        }
                        CVar19 = CVar2;
                      } while (CVar2 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y));
                      filename._M_dataplus._M_p = (pointer)0x3f800000;
                      filename._M_string_length._0_4_ = 0.0;
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      Imf_2_5::CubeMap::faceAndPixelPosition((V3f *)&filename,pBVar14,&face,&pos);
                      if (face != CUBEFACE_POS_X) {
                        __assert_fail("face == CUBEFACE_POS_X",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x123,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      bVar7 = true;
                      pVVar21 = &pos;
                      do {
                        fVar24 = pVVar21->x;
                        fVar24 = (float)(-(uint)(63.5 < fVar24) & (uint)(fVar24 + -63.5) |
                                        ~-(uint)(63.5 < fVar24) & (uint)(63.5 - fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        pVVar21 = (V2f *)pfVar1;
                      } while (fVar24 <= 0.000128);
                      if (0.000128 < fVar24) {
                        __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x124,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0xbf800000;
                      filename._M_string_length._0_4_ = 0.0;
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      Imf_2_5::CubeMap::faceAndPixelPosition((V3f *)&filename,pBVar14,&face,&pos);
                      if (face != CUBEFACE_NEG_X) {
                        __assert_fail("face == CUBEFACE_NEG_X",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x12a,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      bVar7 = true;
                      pVVar21 = &pos;
                      do {
                        fVar24 = pVVar21->x;
                        fVar24 = (float)(-(uint)(63.5 < fVar24) & (uint)(fVar24 + -63.5) |
                                        ~-(uint)(63.5 < fVar24) & (uint)(63.5 - fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        pVVar21 = (V2f *)pfVar1;
                      } while (fVar24 <= 0.000128);
                      if (0.000128 < fVar24) {
                        __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,299,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                      filename._M_string_length._0_4_ = 0.0;
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      Imf_2_5::CubeMap::faceAndPixelPosition((V3f *)&filename,pBVar14,&face,&pos);
                      if (face != CUBEFACE_POS_Y) {
                        __assert_fail("face == CUBEFACE_POS_Y",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x131,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      bVar7 = true;
                      pVVar21 = &pos;
                      do {
                        fVar24 = pVVar21->x;
                        fVar24 = (float)(-(uint)(63.5 < fVar24) & (uint)(fVar24 + -63.5) |
                                        ~-(uint)(63.5 < fVar24) & (uint)(63.5 - fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        pVVar21 = (V2f *)pfVar1;
                      } while (fVar24 <= 0.000128);
                      if (0.000128 < fVar24) {
                        __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x132,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                      filename._M_string_length._0_4_ = 0.0;
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      Imf_2_5::CubeMap::faceAndPixelPosition((V3f *)&filename,pBVar14,&face,&pos);
                      if (face != CUBEFACE_NEG_Y) {
                        __assert_fail("face == CUBEFACE_NEG_Y",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x138,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      bVar7 = true;
                      pVVar21 = &pos;
                      do {
                        fVar24 = pVVar21->x;
                        fVar24 = (float)(-(uint)(63.5 < fVar24) & (uint)(fVar24 + -63.5) |
                                        ~-(uint)(63.5 < fVar24) & (uint)(63.5 - fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        pVVar21 = (V2f *)pfVar1;
                      } while (fVar24 <= 0.000128);
                      if (0.000128 < fVar24) {
                        __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x139,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0x0;
                      filename._M_string_length._0_4_ = 1.0;
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      Imf_2_5::CubeMap::faceAndPixelPosition((V3f *)&filename,pBVar14,&face,&pos);
                      if (face != CUBEFACE_POS_Z) {
                        __assert_fail("face == CUBEFACE_POS_Z",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x13f,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      bVar7 = true;
                      pVVar21 = &pos;
                      do {
                        fVar24 = pVVar21->x;
                        fVar24 = (float)(-(uint)(63.5 < fVar24) & (uint)(fVar24 + -63.5) |
                                        ~-(uint)(63.5 < fVar24) & (uint)(63.5 - fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        pVVar21 = (V2f *)pfVar1;
                      } while (fVar24 <= 0.000128);
                      if (0.000128 < fVar24) {
                        __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x140,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      filename._M_dataplus._M_p = (pointer)0x0;
                      filename._M_string_length._0_4_ = -1.0;
                      pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                      Imf_2_5::CubeMap::faceAndPixelPosition((V3f *)&filename,pBVar14,&face,&pos);
                      if (face != CUBEFACE_NEG_Z) {
                        __assert_fail("face == CUBEFACE_NEG_Z",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x146,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      bVar7 = true;
                      pVVar21 = &pos;
                      do {
                        fVar24 = pVVar21->x;
                        fVar24 = (float)(-(uint)(63.5 < fVar24) & (uint)(fVar24 + -63.5) |
                                        ~-(uint)(63.5 < fVar24) & (uint)(63.5 - fVar24));
                        if (!bVar7) break;
                        bVar7 = false;
                        pVVar21 = (V2f *)pfVar1;
                      } while (fVar24 <= 0.000128);
                      if (0.000128 < fVar24) {
                        __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                      ,0x147,
                                      "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                     );
                      }
                      pRVar15 = (Rgba *)operator_new__(0xc0000);
                      phVar16 = &pRVar15->b;
                      lVar23 = 0;
                      do {
                        lVar22 = 0;
                        do {
                          phVar16[lVar22 * 4]._h = 0;
                          *(undefined4 *)(phVar16 + lVar22 * 4 + -2) = 0;
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 0x80);
                        lVar23 = lVar23 + 1;
                        phVar16 = phVar16 + 0x200;
                      } while (lVar23 != 0x300);
                      CVar19 = CUBEFACE_POS_X;
                      do {
                        iVar9 = 0;
                        do {
                          iVar17 = 0;
                          do {
                            pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                            stack0xfffffffffffffc0c = (float)iVar9;
                            rand._state._0_4_ = (float)iVar17;
                            Imf_2_5::CubeMap::pixelPosition
                                      ((CubeMap *)&out,CVar19,pBVar14,(V2f *)&rand);
                            fVar45 = out._vptr_RgbaOutputFile._4_4_;
                            fVar24 = out._vptr_RgbaOutputFile._0_4_;
                            pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                            r9.d = (uint)(float)iVar9;
                            r9.n = (int)(float)iVar17;
                            Imf_2_5::CubeMap::direction
                                      ((CubeMap *)&filename,CVar19,pBVar14,(V2f *)&r9);
                            Imath_2_5::Vec3<float>::normalize((Vec3<float> *)&filename);
                            fVar51 = filename._M_dataplus._M_p._0_4_ + 1.0;
                            if ((fVar51 != 0.0) || (NAN(fVar51))) {
                              if (half::_eLut[(uint)fVar51 >> 0x17] == 0) {
                                uVar8 = half::convert((int)fVar51);
                              }
                              else {
                                uVar8 = half::_eLut[(uint)fVar51 >> 0x17] +
                                        (short)(((uint)fVar51 & 0x7fffff) + 0xfff +
                                                (uint)(((uint)fVar51 >> 0xd & 1) != 0) >> 0xd);
                              }
                            }
                            else {
                              uVar8 = 0;
                            }
                            iVar18 = (int)(fVar45 + 0.5);
                            lVar23 = (long)(int)(fVar24 + 0.5);
                            pRVar15[(long)iVar18 * 0x80 + lVar23].r._h = uVar8;
                            fVar24 = filename._M_dataplus._M_p._4_4_ + 1.0;
                            if ((fVar24 != 0.0) || (NAN(fVar24))) {
                              if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                                uVar8 = half::convert((int)fVar24);
                              }
                              else {
                                uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                        (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                                (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                              }
                            }
                            else {
                              uVar8 = 0;
                            }
                            pRVar15[(long)iVar18 * 0x80 + lVar23].g._h = uVar8;
                            fVar24 = (float)filename._M_string_length + 1.0;
                            if ((fVar24 != 0.0) || (NAN(fVar24))) {
                              if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                                uVar8 = half::convert((int)fVar24);
                              }
                              else {
                                uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                        (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                                (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                              }
                            }
                            else {
                              uVar8 = 0;
                            }
                            pRVar15[(long)iVar18 * 0x80 + lVar23].b._h = uVar8;
                            iVar17 = iVar17 + 1;
                          } while (iVar17 != 0x80);
                          iVar9 = iVar9 + 1;
                        } while (iVar9 != 0x80);
                        CVar19 = CVar19 + CUBEFACE_NEG_X;
                      } while (CVar19 != (CUBEFACE_POS_Z|CUBEFACE_POS_Y));
                      iVar9 = Imf_2_5::globalThreadCount();
                      Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                ((RgbaOutputFile *)&filename,(char *)uVar6,(Header *)&M1,WRITE_RGB,
                                 iVar9);
                      Imf_2_5::RgbaOutputFile::setFrameBuffer
                                ((RgbaOutputFile *)&filename,pRVar15,1,0x80);
                      Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&filename,0x300);
                      Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&filename);
                      phVar16 = &pRVar15->b;
                      lVar23 = 0;
                      do {
                        lVar22 = 0;
                        do {
                          if ((((half::_toFloat[phVar16[lVar22 * 4 + -2]._h].f == 0.0) &&
                               (half::_toFloat[phVar16[lVar22 * 4 + -1]._h].f == 0.0)) &&
                              (!NAN(half::_toFloat[phVar16[lVar22 * 4 + -1]._h].f))) &&
                             ((half::_toFloat[phVar16[lVar22 * 4]._h].f == 0.0 &&
                              (!NAN(half::_toFloat[phVar16[lVar22 * 4]._h].f))))) {
                            __assert_fail("p.r != 0 || p.g != 0 || p.b != 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x177,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 0x80);
                        lVar23 = lVar23 + 1;
                        phVar16 = phVar16 + 0x200;
                      } while (lVar23 != 0x300);
                      _rand_1 = CONCAT26(uStack_44a,0x5a5a5a5a5a5a);
                      iVar9 = 0;
                      while( true ) {
                        Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>
                                  ((Imath_2_5 *)&filename,&rand_1);
                        pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::faceAndPixelPosition
                                  ((V3f *)&filename,pBVar14,&face_2,&pif);
                        CVar19 = face_2;
                        pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        local_3b8.x = pif.x;
                        local_3b8.y = pif.y;
                        Imf_2_5::CubeMap::pixelPosition
                                  ((CubeMap *)&pos_2,CVar19,pBVar14,(V2f *)&local_3b8);
                        fVar51 = pos_2.y;
                        fVar45 = pos_2.x;
                        fVar24 = (filename._M_dataplus._M_p._0_4_ + 1.0) * 0.8;
                        if ((fVar24 != 0.0) || (NAN(fVar24))) {
                          if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                            uVar8 = half::convert((int)fVar24);
                          }
                          else {
                            uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                    (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                            (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else {
                          uVar8 = (unsigned_short)((uint)fVar24 >> 0x10);
                        }
                        iVar17 = (int)(fVar51 + 0.5);
                        lVar23 = (long)(int)(fVar45 + 0.5);
                        fVar24 = (filename._M_dataplus._M_p._4_4_ + 1.0) * 0.8;
                        pRVar15[(long)iVar17 * 0x80 + lVar23].r._h = uVar8;
                        if ((fVar24 != 0.0) || (NAN(fVar24))) {
                          if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                            uVar8 = half::convert((int)fVar24);
                          }
                          else {
                            uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                    (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                            (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else {
                          uVar8 = (unsigned_short)((uint)fVar24 >> 0x10);
                        }
                        fVar24 = ((float)filename._M_string_length + 1.0) * 0.8;
                        pRVar15[(long)iVar17 * 0x80 + lVar23].g._h = uVar8;
                        if ((fVar24 != 0.0) || (NAN(fVar24))) {
                          if (half::_eLut[(uint)fVar24 >> 0x17] == 0) {
                            uVar8 = half::convert((int)fVar24);
                          }
                          else {
                            uVar8 = half::_eLut[(uint)fVar24 >> 0x17] +
                                    (short)(((uint)fVar24 & 0x7fffff) + 0xfff +
                                            (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else {
                          uVar8 = (unsigned_short)((uint)fVar24 >> 0x10);
                        }
                        pRVar15[(long)iVar17 * 0x80 + lVar23].b._h = uVar8;
                        CVar19 = face_2;
                        pBVar14 = Imf_2_5::Header::dataWindow((Header *)&M1);
                        Imf_2_5::CubeMap::direction((CubeMap *)&out,CVar19,pBVar14,&pif);
                        Imath_2_5::Vec3<float>::normalized((Vec3<float> *)&r9);
                        if (1e-06 < (float)(~-(uint)((float)r9.n < filename._M_dataplus._M_p._0_4_)
                                            & (uint)((float)r9.n - filename._M_dataplus._M_p._0_4_)
                                           | (uint)(filename._M_dataplus._M_p._0_4_ - (float)r9.n) &
                                             -(uint)((float)r9.n < filename._M_dataplus._M_p._0_4_))
                           ) break;
                        lVar23 = 1;
                        do {
                          lVar22 = lVar23;
                          if (lVar22 == 3) goto LAB_0019864b;
                          fVar24 = *(float *)((long)&filename._M_dataplus._M_p + lVar22 * 4);
                          fVar45 = (float)(&r9.n)[lVar22];
                          lVar23 = lVar22 + 1;
                        } while ((float)(~-(uint)(fVar45 < fVar24) & (uint)(fVar45 - fVar24) |
                                        (uint)(fVar24 - fVar45) & -(uint)(fVar45 < fVar24)) <= 1e-06
                                );
                        if (lVar22 - 1U < 2) break;
LAB_0019864b:
                        iVar9 = iVar9 + 1;
                        if (iVar9 == 0x48000) {
                          iVar9 = Imf_2_5::globalThreadCount();
                          Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                    ((RgbaOutputFile *)&filename,(char *)VVar5,(Header *)&M1,
                                     WRITE_RGB,iVar9);
                          Imf_2_5::RgbaOutputFile::setFrameBuffer
                                    ((RgbaOutputFile *)&filename,pRVar15,1,0x80);
                          Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&filename,0x300);
                          Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&filename);
                          remove((char *)uVar6);
                          remove((char *)VVar5);
                          operator_delete__(pRVar15);
                          Imf_2_5::Header::~Header((Header *)&M1);
                          if (c.red != (V2f)&c.blue) {
                            operator_delete((void *)c.red,CONCAT44(c.blue.y,c.blue.x) + 1);
                          }
                          if ((float (*) [4])M2.x[0]._0_8_ != M2.x + 1) {
                            operator_delete((void *)M2.x[0]._0_8_,M2.x[1]._0_8_ + 1);
                          }
                          c.red = (V2f)&c.blue;
                          pcVar3 = (tempDir->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&c,pcVar3,pcVar3 + tempDir->_M_string_length);
                          std::__cxx11::string::append((char *)&c);
                          VVar5 = c.red;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"key code attribute",0x12);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                          std::ostream::put('p');
                          std::ostream::flush();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"writing, ",9);
                          Imf_2_5::KeyCode::KeyCode
                                    ((KeyCode *)&filename,0xc,0x22,0x1e240,0x4d2,0x2d,3,0x50);
                          iVar9 = Imf_2_5::KeyCode::filmMfcCode((KeyCode *)&filename);
                          if (iVar9 != 0xc) {
                            __assert_fail("k1.filmMfcCode() == 12",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1ac,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::filmType((KeyCode *)&filename);
                          if (iVar9 != 0x22) {
                            __assert_fail("k1.filmType() == 34",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1ad,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::prefix((KeyCode *)&filename);
                          if (iVar9 != 0x1e240) {
                            __assert_fail("k1.prefix() == 123456",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1ae,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::count((KeyCode *)&filename);
                          if (iVar9 != 0x4d2) {
                            __assert_fail("k1.count() == 1234",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1af,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::perfOffset((KeyCode *)&filename);
                          if (iVar9 != 0x2d) {
                            __assert_fail("k1.perfOffset() == 45",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1b0,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::perfsPerFrame((KeyCode *)&filename);
                          if (iVar9 != 3) {
                            __assert_fail("k1.perfsPerFrame() == 3",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1b1,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::perfsPerCount((KeyCode *)&filename);
                          if (iVar9 != 0x50) {
                            __assert_fail("k1.perfsPerCount() == 80",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1b2,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          M1.x[0][0] = 0.0;
                          M1.x[0][1] = 0.0;
                          Imf_2_5::Header::Header
                                    ((Header *)&M2,100,100,1.0,(V2f *)&M1,1.0,INCREASING_Y,
                                     ZIP_COMPRESSION);
                          bVar7 = Imf_2_5::hasKeyCode((Header *)&M2);
                          if (bVar7) {
                            __assert_fail("hasKeyCode (header) == false",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1b8,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          Imf_2_5::addKeyCode((Header *)&M2,(KeyCode *)&filename);
                          bVar7 = Imf_2_5::hasKeyCode((Header *)&M2);
                          if (!bVar7) {
                            __assert_fail("hasKeyCode (header) == true",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1bb,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::globalThreadCount();
                          Imf_2_5::RgbaOutputFile::RgbaOutputFile
                                    (&out,(char *)VVar5,(Header *)&M2,WRITE_RGBA,iVar9);
                          lVar23 = 0;
                          do {
                            *(unsigned_short *)(M1.x[0] + lVar23 * 2) = 0x3c00;
                            *(unsigned_short *)((long)M1.x[0] + lVar23 * 8 + 2) = 0x3c00;
                            *(unsigned_short *)(M1.x[0] + lVar23 * 2 + 1) = 0x3c00;
                            *(unsigned_short *)((long)M1.x[0] + lVar23 * 8 + 6) = 0x3c00;
                            lVar23 = lVar23 + 1;
                          } while (lVar23 != 100);
                          Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,(Rgba *)&M1,1,0);
                          Imf_2_5::RgbaOutputFile::writePixels(&out,100);
                          Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"reading, comparing",0x12);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                          std::ostream::put('p');
                          std::ostream::flush();
                          iVar9 = Imf_2_5::globalThreadCount();
                          Imf_2_5::RgbaInputFile::RgbaInputFile
                                    ((RgbaInputFile *)&M1,(char *)VVar5,iVar9);
                          pHVar12 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                          this = Imf_2_5::keyCode(pHVar12);
                          pHVar12 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&M1);
                          bVar7 = Imf_2_5::hasKeyCode(pHVar12);
                          if (!bVar7) {
                            __assert_fail("hasKeyCode (in.header()) == true",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1d3,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::filmMfcCode((KeyCode *)&filename);
                          iVar17 = Imf_2_5::KeyCode::filmMfcCode(this);
                          if (iVar9 != iVar17) {
                            __assert_fail("k1.filmMfcCode() == k2.filmMfcCode()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1d4,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::filmType((KeyCode *)&filename);
                          iVar17 = Imf_2_5::KeyCode::filmType(this);
                          if (iVar9 != iVar17) {
                            __assert_fail("k1.filmType() == k2.filmType()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1d5,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::prefix((KeyCode *)&filename);
                          iVar17 = Imf_2_5::KeyCode::prefix(this);
                          if (iVar9 != iVar17) {
                            __assert_fail("k1.prefix() == k2.prefix()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1d6,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::count((KeyCode *)&filename);
                          iVar17 = Imf_2_5::KeyCode::count(this);
                          if (iVar9 != iVar17) {
                            __assert_fail("k1.count() == k2.count()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1d7,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::perfOffset((KeyCode *)&filename);
                          iVar17 = Imf_2_5::KeyCode::perfOffset(this);
                          if (iVar9 != iVar17) {
                            __assert_fail("k1.perfOffset() == k2.perfOffset()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1d8,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::perfsPerFrame((KeyCode *)&filename);
                          iVar17 = Imf_2_5::KeyCode::perfsPerFrame(this);
                          if (iVar9 != iVar17) {
                            __assert_fail("k1.perfsPerFrame() == k2.perfsPerFrame()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1d9,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          iVar9 = Imf_2_5::KeyCode::perfsPerCount((KeyCode *)&filename);
                          iVar17 = Imf_2_5::KeyCode::perfsPerCount(this);
                          if (iVar9 != iVar17) {
                            __assert_fail("k1.perfsPerCount() == k2.perfsPerCount()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1da,
                                          "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                         );
                          }
                          Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                          remove((char *)VVar5);
                          Imf_2_5::Header::~Header((Header *)&M2);
                          if (c.red != (V2f)&c.blue) {
                            operator_delete((void *)c.red,CONCAT44(c.blue.y,c.blue.x) + 1);
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"time code methods",0x11);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                          std::ostream::put('p');
                          std::ostream::flush();
                          Imf_2_5::TimeCode::TimeCode((TimeCode *)&M1);
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0) {
                            __assert_fail("t.timeAndFlags() == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1e8,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::userData((TimeCode *)&M1);
                          if (uVar10 != 0) {
                            __assert_fail("t.userData() == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1e9,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                          Imf_2_5::TimeCode::setFrame((TimeCode *)&M1,0x1d);
                          iVar9 = Imf_2_5::TimeCode::frame((TimeCode *)&M1);
                          if (iVar9 != 0x1d) {
                            __assert_fail("t.frame() == 29",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1ef,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0x29) {
                            __assert_fail("t.timeAndFlags() == 0x00000029",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1f0,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags
                                    ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                          Imf_2_5::TimeCode::setFrame((TimeCode *)&M1,0);
                          iVar9 = Imf_2_5::TimeCode::frame((TimeCode *)&M1);
                          if (iVar9 != 0) {
                            __assert_fail("t.frame() == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,500,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0xffffffc0) {
                            __assert_fail("t.timeAndFlags() == 0xffffffc0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1f5,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                          Imf_2_5::TimeCode::setSeconds((TimeCode *)&M1,0x3b);
                          iVar9 = Imf_2_5::TimeCode::seconds((TimeCode *)&M1);
                          if (iVar9 != 0x3b) {
                            __assert_fail("t.seconds() == 59",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1fb,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0x5900) {
                            __assert_fail("t.timeAndFlags() == 0x00005900",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x1fc,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags
                                    ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                          Imf_2_5::TimeCode::setSeconds((TimeCode *)&M1,0);
                          iVar9 = Imf_2_5::TimeCode::seconds((TimeCode *)&M1);
                          if (iVar9 != 0) {
                            __assert_fail("t.seconds() == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x200,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0xffff80ff) {
                            __assert_fail("t.timeAndFlags() == 0xffff80ff",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x201,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                          Imf_2_5::TimeCode::setMinutes((TimeCode *)&M1,0x3b);
                          iVar9 = Imf_2_5::TimeCode::minutes((TimeCode *)&M1);
                          if (iVar9 != 0x3b) {
                            __assert_fail("t.minutes() == 59",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x207,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0x590000) {
                            __assert_fail("t.timeAndFlags() == 0x00590000",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x208,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags
                                    ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                          Imf_2_5::TimeCode::setMinutes((TimeCode *)&M1,0);
                          iVar9 = Imf_2_5::TimeCode::minutes((TimeCode *)&M1);
                          if (iVar9 != 0) {
                            __assert_fail("t.minutes() == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x20c,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0xff80ffff) {
                            __assert_fail("t.timeAndFlags() == 0xff80ffff",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x20d,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                          Imf_2_5::TimeCode::setHours((TimeCode *)&M1,0x17);
                          iVar9 = Imf_2_5::TimeCode::hours((TimeCode *)&M1);
                          if (iVar9 != 0x17) {
                            __assert_fail("t.hours() == 23",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x213,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0x23000000) {
                            __assert_fail("t.timeAndFlags() == 0x23000000",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x214,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags
                                    ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                          Imf_2_5::TimeCode::setHours((TimeCode *)&M1,0);
                          iVar9 = Imf_2_5::TimeCode::hours((TimeCode *)&M1);
                          if (iVar9 != 0) {
                            __assert_fail("t.hours() == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x218,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0xc0ffffff) {
                            __assert_fail("t.timeAndFlags() == 0xc0ffffff",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x219,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                          Imf_2_5::TimeCode::setDropFrame((TimeCode *)&M1,true);
                          bVar7 = Imf_2_5::TimeCode::dropFrame((TimeCode *)&M1);
                          if (!bVar7) {
                            __assert_fail("t.dropFrame() == true",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x21f,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0x40) {
                            __assert_fail("t.timeAndFlags() == 0x00000040",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x220,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags
                                    ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                          Imf_2_5::TimeCode::setDropFrame((TimeCode *)&M1,false);
                          bVar7 = Imf_2_5::TimeCode::dropFrame((TimeCode *)&M1);
                          if (bVar7) {
                            __assert_fail("t.dropFrame() == false",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x224,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0xffffffbf) {
                            __assert_fail("t.timeAndFlags() == 0xffffffbf",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x225,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                          Imf_2_5::TimeCode::setColorFrame((TimeCode *)&M1,true);
                          bVar7 = Imf_2_5::TimeCode::colorFrame((TimeCode *)&M1);
                          if (!bVar7) {
                            __assert_fail("t.colorFrame() == true",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x22b,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0x80) {
                            __assert_fail("t.timeAndFlags() == 0x00000080",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x22c,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags
                                    ((TimeCode *)&M1,0xffffffff,TV60_PACKING);
                          Imf_2_5::TimeCode::setColorFrame((TimeCode *)&M1,false);
                          bVar7 = Imf_2_5::TimeCode::colorFrame((TimeCode *)&M1);
                          if (bVar7) {
                            __assert_fail("t.colorFrame() == false",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x230,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0xffffff7f) {
                            __assert_fail("t.timeAndFlags() == 0xffffff7f",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x231,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::setTimeAndFlags((TimeCode *)&M1,0,TV60_PACKING);
                          Imf_2_5::TimeCode::setFieldPhase((TimeCode *)&M1,true);
                          bVar7 = Imf_2_5::TimeCode::fieldPhase((TimeCode *)&M1);
                          if (!bVar7) {
                            __assert_fail("t.fieldPhase() == true",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x237,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          uVar10 = Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV60_PACKING);
                          if (uVar10 != 0x8000) {
                            __assert_fail("t.timeAndFlags (TimeCode::TV60_PACKING) == 0x00008000",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                          ,0x238,"void (anonymous namespace)::timeCodeMethods()");
                          }
                          Imf_2_5::TimeCode::timeAndFlags((TimeCode *)&M1,TV50_PACKING);
                          __assert_fail("t.timeAndFlags (TimeCode::TV50_PACKING) == 0x80000000",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                        ,0x239,"void (anonymous namespace)::timeCodeMethods()");
                        }
                      }
                      __assert_fail("dir.equalWithAbsError (dir1.normalized(), 1e-6f)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                    ,399,
                                    "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                   );
                    }
                  }
                  __assert_fail("c1.red == c2.red",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                                ,0x98,
                                "void (anonymous namespace)::writeReadChromaticities(const char *)")
                  ;
                }
              }
              __assert_fail("W2.equalWithAbsError (V3f (1, 1, 1), 1e-3F)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                            ,0x6c,"void (anonymous namespace)::convertRGBtoXYZ()");
            }
          }
          __assert_fail("B2.equalWithAbsError (V3f (0, 0, 1), 1e-3F)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                        ,0x6b,"void (anonymous namespace)::convertRGBtoXYZ()");
        }
      }
      __assert_fail("G2.equalWithAbsError (V3f (0, 1, 0), 1e-3F)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                    ,0x6a,"void (anonymous namespace)::convertRGBtoXYZ()");
    }
  }
  __assert_fail("R2.equalWithAbsError (V3f (1, 0, 0), 1e-3F)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                ,0x69,"void (anonymous namespace)::convertRGBtoXYZ()");
}

Assistant:

void
testStandardAttributes (const std::string &tempDir)
{
    try
    {
	cout << "Testing optional standard attributes" << endl;

	convertRGBtoXYZ();

	{
	    std::string filename = tempDir + "imf_test_chromaticities.exr";
	    writeReadChromaticities (filename.c_str());
	}

	{
	    std::string fn1 = tempDir + "imf_test_latlong1.exr";
	    std::string fn2 = tempDir + "imf_test_latlong2.exr";
	    latLongMap (fn1.c_str(), fn2.c_str());
	}

	{
	    std::string fn1 = tempDir + "imf_test_cube1.exr";
	    std::string fn2 = tempDir + "imf_test_cube2.exr";
	    cubeMap (fn1.c_str(), fn2.c_str());
	}

	{
	    std::string filename = tempDir + "imf_test_keycode.exr";
	    writeReadKeyCode (filename.c_str());
	}

	{
	    timeCodeMethods();
	    std::string filename = tempDir + "imf_test_timecode.exr";
	    writeReadTimeCode (filename.c_str());
	}

	{
	    rationalMethods();
	    std::string filename = tempDir + "imf_test_rational.exr";
	    writeReadRational (filename.c_str());
	}

	generatedFunctions();

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}